

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

ostream * __thiscall nivalis::Expr::to_bin(Expr *this,ostream *os)

{
  pointer pAVar1;
  long lVar2;
  ulong uVar3;
  long local_38;
  undefined8 local_30;
  
  local_38 = (long)(this->ast).
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->ast).
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  lVar2 = 8;
  std::ostream::write((char *)os,(long)&local_38);
  pAVar1 = (this->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ast).
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    uVar3 = 0;
    do {
      local_30 = *(undefined8 *)((long)&pAVar1->opcode + lVar2);
      local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)((long)pAVar1 + lVar2 + -8));
      std::ostream::write((char *)os,(long)&local_38);
      uVar3 = uVar3 + 1;
      pAVar1 = (this->ast).
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)(this->ast).
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4));
  }
  return os;
}

Assistant:

std::ostream& Expr::to_bin(std::ostream& os) const {
    util::write_bin(os, ast.size());
    for (size_t i = 0; i < ast.size(); ++i) {
        util::write_bin(os, ast[i]);
    }
    return os;
}